

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O3

void test_inst(float id,Am_Object *obj,Am_Object *names,int size)

{
  bool bVar1;
  char cVar2;
  ulong uVar3;
  ostream *poVar4;
  long lVar5;
  long lVar6;
  Am_Object *this;
  ulong uVar7;
  Am_Object *pAVar8;
  Am_Object *pAVar9;
  Am_Instance_Iterator iter;
  Am_Object result_names [10];
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  long local_c0;
  long local_b8;
  Am_Object *local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  Am_Object local_90;
  Am_Object local_88 [11];
  
  local_88[8].data = (Am_Object_Data *)0x0;
  local_88[9].data = (Am_Object_Data *)0x0;
  local_88[6].data = (Am_Object_Data *)0x0;
  local_88[7].data = (Am_Object_Data *)0x0;
  local_88[4].data = (Am_Object_Data *)0x0;
  local_88[5].data = (Am_Object_Data *)0x0;
  local_88[2].data = (Am_Object_Data *)0x0;
  local_88[3].data = (Am_Object_Data *)0x0;
  local_88[0].data = (Am_Object_Data *)0x0;
  local_88[1].data = (Am_Object_Data *)0x0;
  Am_Object::Am_Object(&local_d8,obj);
  Am_Instance_Iterator::Am_Instance_Iterator
            ((Am_Instance_Iterator *)&local_d0,(Am_Object_Data *)&local_d8);
  Am_Object::~Am_Object(&local_d8);
  Am_Instance_Iterator::Start();
  uVar3 = (ulong)(uint)size;
  pAVar8 = local_88;
  lVar6 = 0;
  while (cVar2 = Am_Instance_Iterator::Last(), cVar2 == '\0') {
    Am_Instance_Iterator::Get();
    Am_Object::operator=(pAVar8,&local_90);
    Am_Object::~Am_Object(&local_90);
    lVar6 = lVar6 + -1;
    pAVar8 = pAVar8 + 1;
    Am_Instance_Iterator::Next();
  }
  local_c0 = -lVar6;
  if (size + (uint)lVar6 == 0) {
    if ((uint)size < 2) {
      bVar1 = false;
LAB_0010704e:
      if (size == 0) {
        if (!bVar1) goto LAB_001072cd;
      }
      else if (0 < size) {
        lVar5 = 0;
        do {
          uVar7 = uVar3;
          pAVar8 = names;
          while (cVar2 = Am_Object::operator==(pAVar8,local_88 + lVar5), cVar2 == '\0') {
            pAVar8 = pAVar8 + 1;
            uVar7 = uVar7 - 1;
            if (uVar7 == 0) goto LAB_0010709b;
          }
          lVar5 = lVar5 + 1;
        } while (local_c0 != lVar5);
LAB_001072cd:
        if (suppress_successful == 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  result is expected",0x14);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
          std::ostream::put('@');
          std::ostream::flush();
        }
        goto LAB_0010728b;
      }
LAB_0010709b:
      poVar4 = std::ostream::_M_insert<double>((double)id);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"       returned objects do not match expected",0x2d);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
    else {
      local_a8 = (ulong)~(uint)lVar6;
      uVar7 = 1;
      pAVar8 = local_88;
      local_a0 = 0;
      bVar1 = false;
      local_b8 = lVar6;
      local_b0 = names;
      do {
        pAVar8 = pAVar8 + 1;
        this = local_88 + local_a0;
        local_a0 = local_a0 + 1;
        pAVar9 = pAVar8;
        local_98 = uVar7;
        do {
          cVar2 = Am_Object::operator==(this,pAVar9);
          names = local_b0;
          lVar6 = local_b8;
          if (cVar2 != '\0') {
            bVar1 = true;
          }
          uVar7 = uVar7 + 1;
          pAVar9 = pAVar9 + 1;
        } while (uVar7 < uVar3);
        uVar7 = local_98 + 1;
      } while (local_a0 != local_a8);
      if (!bVar1) goto LAB_0010704e;
      poVar4 = std::ostream::_M_insert<double>((double)id);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"       object returned more than once",0x25);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
    std::ostream::put((char)poVar4);
    std::ostream::flush();
  }
  else {
    printf("%f       number of objects do not match\n",SUB84((double)id,0));
  }
  if (0 < size) {
    uVar7 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"expected object[",0x10);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar7);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = ",4);
      poVar4 = (ostream *)operator<<(poVar4,names);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      uVar7 = uVar7 + 1;
      names = names + 1;
    } while (uVar3 != uVar7);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  if (lVar6 != 0) {
    pAVar8 = local_88;
    lVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"result object[",0xe)
      ;
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = ",4);
      poVar4 = (ostream *)operator<<(poVar4,pAVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
      lVar6 = lVar6 + 1;
      pAVar8 = pAVar8 + 1;
    } while (local_c0 != lVar6);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"*** TEST DID NOT SUCCEED. ***",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  failed_tests = failed_tests + 1;
LAB_0010728b:
  Am_Object::~Am_Object(&local_c8);
  Am_Object::~Am_Object(&local_d0);
  lVar6 = 0x48;
  do {
    Am_Object::~Am_Object((Am_Object *)((long)&local_88[0].data + lVar6));
    lVar6 = lVar6 + -8;
  } while (lVar6 != -8);
  return;
}

Assistant:

void
test_inst(float id, Am_Object obj, Am_Object names[], int size)
{
  Am_Object result_names[10];
  int num_results = 0;
  int i, j;

  Am_Instance_Iterator iter = obj;
  iter.Start();
  while (!iter.Last()) {
    result_names[num_results++] = iter.Get();
    iter.Next();
  }
  if (num_results == size) {
    bool fail = false;
    for (i = 0; i < num_results - 1; ++i)
      for (j = i + 1; j < num_results; ++j)
        if (result_names[i] == result_names[j])
          fail = true;
    if (!fail) {
      for (i = 0; i < num_results; ++i) {
        fail = true;
        for (j = 0; j < size; ++j)
          if (names[j] == result_names[i]) {
            fail = false;
            break;
          }
        if (fail)
          break;
      }
      if (!fail) {
        if (!suppress_successful)
          cout << "  result is expected" << endl;
        return;
      } else
        cout << id << "       returned objects do not match expected" << endl;
    } else
      cout << id << "       object returned more than once" << endl;
  } else
    printf("%f       number of objects do not match\n", id);
  for (i = 0; i < size; ++i)
    cout << "expected object[" << i << "] = " << names[i] << " ";
  cout << endl;
  for (i = 0; i < num_results; ++i)
    cout << "result object[" << i << "] = " << result_names[i] << " ";
  cout << endl;
  cout << "*** TEST DID NOT SUCCEED. ***" << endl;
  ++failed_tests;
}